

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ringbuffer.cpp
# Opt level: O1

void * __thiscall CRingBufferBase::Allocate(CRingBufferBase *this,int Size)

{
  CItem *pCVar1;
  uint uVar2;
  int iVar3;
  CItem *pCVar4;
  CItem *pCVar5;
  long lVar6;
  int iVar7;
  
  uVar2 = (uint)(((long)Size + 0x2fU) / 3) & 0xfffffff8;
  iVar7 = uVar2 * 3;
  if (iVar7 <= this->m_Size) {
    do {
      pCVar4 = this->m_pProduce;
      if (pCVar4->m_Free == 0) {
LAB_001cbdb4:
        pCVar4 = (CItem *)0x0;
      }
      else if (pCVar4->m_Size < iVar7) {
        pCVar5 = this->m_pFirst;
        if (pCVar5->m_Free == 0) goto LAB_001cbdb4;
        pCVar4 = (CItem *)0x0;
        if (iVar7 <= pCVar5->m_Size) {
          pCVar4 = pCVar5;
        }
      }
      if (pCVar4 != (CItem *)0x0) {
        iVar3 = pCVar4->m_Size;
        if (iVar7 + 0x18 < iVar3) {
          lVar6 = (long)iVar7;
          pCVar5 = (CItem *)((long)&pCVar4->m_pPrev + lVar6);
          *(CItem **)((long)&pCVar4->m_pPrev + lVar6) = pCVar4;
          pCVar1 = pCVar4->m_pNext;
          *(CItem **)((long)&pCVar4->m_pNext + lVar6) = pCVar1;
          if (pCVar1 != (CItem *)0x0) {
            pCVar1->m_pPrev = pCVar5;
          }
          pCVar4->m_pNext = pCVar5;
          pCVar5->m_Free = 1;
          pCVar5->m_Size = iVar3 + uVar2 * -3;
          pCVar4->m_Size = iVar7;
          if (pCVar5->m_pNext == (CItem *)0x0) {
            this->m_pLast = pCVar5;
          }
        }
        pCVar5 = pCVar4->m_pNext;
        if (pCVar5 == (CItem *)0x0) {
          pCVar5 = this->m_pFirst;
        }
        this->m_pProduce = pCVar5;
        pCVar4->m_Free = 0;
        return pCVar4 + 1;
      }
    } while (((this->m_Flags & 1) != 0) && (iVar3 = PopFirst(this), iVar3 != 0));
  }
  return (void *)0x0;
}

Assistant:

void *CRingBufferBase::Allocate(int Size)
{
	int WantedSize = (Size+sizeof(CItem)+sizeof(CItem)-1)/sizeof(CItem)*sizeof(CItem);
	CItem *pBlock = 0;

	// check if we even can fit this block
	if(WantedSize > m_Size)
		return 0;

	while(1)
	{
		// check for space
		if(m_pProduce->m_Free)
		{
			if(m_pProduce->m_Size >= WantedSize)
				pBlock = m_pProduce;
			else
			{
				// wrap around to try to find a block
				if(m_pFirst->m_Free && m_pFirst->m_Size >= WantedSize)
					pBlock = m_pFirst;
			}
		}

		if(pBlock)
			break;
		else
		{
			// we have no block, check our policy and see what todo
			if(m_Flags&FLAG_RECYCLE)
			{
				if(!PopFirst())
					return 0;
			}
			else
				return 0;
		}
	}

	// okey, we have our block

	// split the block if needed
	if(pBlock->m_Size > WantedSize+(int)sizeof(CItem))
	{
		CItem *pNewItem = (CItem *)((char *)pBlock + WantedSize);
		pNewItem->m_pPrev = pBlock;
		pNewItem->m_pNext = pBlock->m_pNext;
		if(pNewItem->m_pNext)
			pNewItem->m_pNext->m_pPrev = pNewItem;
		pBlock->m_pNext = pNewItem;

		pNewItem->m_Free = 1;
		pNewItem->m_Size = pBlock->m_Size - WantedSize;
		pBlock->m_Size = WantedSize;

		if(!pNewItem->m_pNext)
			m_pLast = pNewItem;
	}


	// set next block
	m_pProduce = NextBlock(pBlock);

	// set as used and return the item pointer
	pBlock->m_Free = 0;
	return (void *)(pBlock+1);
}